

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModVerify.cpp
# Opt level: O0

void __thiscall mod_verify::ModVerifyTest2<int>::ModVerifyTest2(ModVerifyTest2<int> *this)

{
  SafeIntException *anon_var_0_1;
  int r_1;
  SafeIntException *anon_var_0;
  int r;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> m;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> x;
  bool overflow;
  bool expected;
  size_t shift;
  size_t width;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined8 in_stack_fffffffffffffe50;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> rhs;
  int local_2c;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_28;
  int local_24;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_20;
  undefined1 local_1a;
  undefined1 local_19;
  undefined8 local_18;
  undefined8 local_10;
  
  local_10 = 4;
  local_18 = 0x1f;
  local_19 = 0;
  local_24 = -0x80000000;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_20,&local_24);
  local_2c = -1;
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
            (&local_28,&local_2c);
  SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
            ((SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> *
             )CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (SafeInt<int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>)
             (int)in_stack_fffffffffffffe50);
  rhs.m_int = (int)((ulong)in_stack_fffffffffffffe50 >> 0x20);
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  local_1a = 0;
  SafeInt::operator_cast_to_int(in_stack_fffffffffffffe40);
  operator%=((int *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),rhs);
  return;
}

Assistant:

ModVerifyTest2<T>()
	{
		const size_t width = sizeof(T);
		const size_t shift = width * CHAR_BIT - 1;

		// GCC using a native built-in int will raise SIGFPE or
		// #DE. However, according to LeBlanc, SafeInt's contract
		// is to return the correct mathematical result or throw.
		// const bool expected = (s == Signed ? true : false);
		const bool expected = false;

		bool overflow;
		SafeInt<T> x = (T)((std::uint64_t)1 << shift);
		SafeInt<T> m((T)-1);

		///////////////////////////////////////////////

		try
		{
			T r;
			r = x % m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}

		///////////////////////////////////////////////

		try
		{
			T r = x;
			r %= m;
			overflow = false;
		}
		catch(SafeIntException&)
		{
			overflow = true;
		}

		if(overflow != expected)
		{
			std::cerr << "Error in case " << type_name<T>() << ": ";
			std::cerr << to_hex((T)x) << ", " << to_hex((T)m) << ", ";
			std::cerr << "expected = " << (expected ? "overflow" : "no overflow") << std::endl;
		}
	}